

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aho-corasick-lite.cpp
# Opt level: O3

bool __thiscall Trie::insert(Trie *this,Unicode *_unicode)

{
  undefined2 uVar1;
  uint32_t uVar2;
  undefined8 in_RAX;
  _Rb_tree_header *p_Var3;
  mapped_type ptVar4;
  mapped_type *pptVar5;
  mapped_type ptVar6;
  _Base_ptr p_Var7;
  ushort *puVar8;
  _Base_ptr p_Var9;
  bool bVar10;
  uint16_t index;
  undefined8 uStack_38;
  
  ptVar6 = this->root;
  puVar8 = (_unicode->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar8 != (_unicode->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>).
                _M_impl.super__Vector_impl_data._M_finish) {
    uStack_38 = in_RAX;
    do {
      uVar1 = *puVar8;
      uStack_38 = CONCAT26(uVar1,(undefined6)uStack_38);
      p_Var7 = (ptVar6->nextMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      if (p_Var7 == (_Base_ptr)0x0) {
LAB_00105603:
        ptVar4 = (mapped_type)operator_new(0x40);
        p_Var3 = &(ptVar4->nextMap)._M_t._M_impl.super__Rb_tree_header;
        (ptVar4->nextMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        (ptVar4->nextMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        (ptVar4->nextMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var3->_M_header;
        (ptVar4->nextMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var3->_M_header
        ;
        (ptVar4->nextMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        ptVar4->search_clue = (trie_node_t *)0x0;
        ptVar4->infoIndex = -1;
        pptVar5 = std::
                  map<unsigned_short,_trie_node_s_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_trie_node_s_*>_>_>
                  ::operator[](&ptVar6->nextMap,(key_type *)((long)&uStack_38 + 6));
        *pptVar5 = ptVar4;
      }
      else {
        p_Var3 = &(ptVar6->nextMap)._M_t._M_impl.super__Rb_tree_header;
        p_Var9 = &p_Var3->_M_header;
        do {
          bVar10 = (ushort)(short)p_Var7[1]._M_color < (ushort)uVar1;
          if (!bVar10) {
            p_Var9 = p_Var7;
          }
          p_Var7 = (&p_Var7->_M_left)[bVar10];
        } while (p_Var7 != (_Base_ptr)0x0);
        if (((_Rb_tree_header *)p_Var9 == p_Var3) ||
           ((ushort)uVar1 < (ushort)(short)p_Var9[1]._M_color)) goto LAB_00105603;
      }
      pptVar5 = std::
                map<unsigned_short,_trie_node_s_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_trie_node_s_*>_>_>
                ::operator[](&ptVar6->nextMap,(key_type *)((long)&uStack_38 + 6));
      ptVar6 = *pptVar5;
      puVar8 = puVar8 + 1;
    } while (puVar8 != (_unicode->
                       super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
                       super__Vector_impl_data._M_finish);
  }
  uVar2 = this->size;
  this->size = uVar2 + 1;
  ptVar6->infoIndex = uVar2;
  return true;
}

Assistant:

bool Trie::insert(Unicode &_unicode)
{
	trie_node_t *node = root;
	uint16_t index;
	auto iter = _unicode.begin();
	for ( ; iter != _unicode.end(); iter++ ) {
		index = *iter;
		if ( node->nextMap.find(index) == node->nextMap.end() ) {
			try {
				node->nextMap[index] = new trie_node_t;
			}
		    catch(const bad_alloc& ) {
				return false;
			}
		}
		node = node->nextMap[index];
	}
	node->infoIndex = size++;
	return true;
}